

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcolor.c
# Opt level: O3

void jinit_color_deconverter(j_decompress_ptr cinfo)

{
  J_COLOR_SPACE JVar1;
  jpeg_error_mgr *pjVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  jpeg_color_deconverter *pjVar7;
  _func_void_j_decompress_ptr *p_Var8;
  code *pcVar9;
  long lVar10;
  boolean *pbVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  int iVar16;
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  int iVar19;
  undefined1 auVar18 [16];
  
  pjVar7 = (jpeg_color_deconverter *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x38);
  cinfo->cconvert = pjVar7;
  pjVar7->start_pass = start_pass_dcolor;
  JVar1 = cinfo->jpeg_color_space;
  if (JVar1 - JCS_RGB < 2) {
    if (cinfo->num_components != 3) goto LAB_00104d38;
  }
  else if (JVar1 - JCS_CMYK < 2) {
    if (cinfo->num_components != 4) goto LAB_00104d38;
  }
  else if (JVar1 == JCS_GRAYSCALE) {
    if (cinfo->num_components != 1) {
LAB_00104d38:
      pjVar2 = cinfo->err;
      pjVar2->msg_code = 0xb;
      (*pjVar2->error_exit)((j_common_ptr)cinfo);
    }
  }
  else if (cinfo->num_components < 1) goto LAB_00104d38;
  JVar1 = cinfo->out_color_space;
  if (JVar1 == JCS_CMYK) {
    cinfo->out_color_components = 4;
    if (cinfo->jpeg_color_space == JCS_CMYK) {
LAB_00104f27:
      pcVar9 = null_convert;
      goto LAB_00104f60;
    }
    if (cinfo->jpeg_color_space == JCS_YCCK) {
      pcVar9 = ycck_cmyk_convert;
LAB_00104f0b:
      pjVar7->color_convert = pcVar9;
      build_ycc_rgb_table(cinfo);
      goto LAB_00104f64;
    }
  }
  else {
    if (JVar1 == JCS_RGB) {
      cinfo->out_color_components = 3;
      JVar1 = cinfo->jpeg_color_space;
      if (JVar1 == JCS_GRAYSCALE) {
        pcVar9 = gray_rgb_convert;
      }
      else {
        if (JVar1 != JCS_RGB) {
          if (JVar1 == JCS_YCbCr) {
            pcVar9 = ycc_rgb_convert;
            goto LAB_00104f0b;
          }
          goto LAB_00104f30;
        }
        pcVar9 = rgb_convert;
      }
LAB_00104f60:
      pjVar7->color_convert = pcVar9;
      goto LAB_00104f64;
    }
    if (JVar1 == JCS_GRAYSCALE) {
      cinfo->out_color_components = 1;
      JVar1 = cinfo->jpeg_color_space;
      if (JVar1 != JCS_YCbCr) {
        if (JVar1 == JCS_RGB) {
          pjVar7->color_convert = rgb_gray_convert;
          pjVar7 = cinfo->cconvert;
          p_Var8 = (_func_void_j_decompress_ptr *)
                   (*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x1800);
          pjVar7[3].start_pass = p_Var8;
          pcVar9 = p_Var8 + 0x1000;
          lVar10 = 0x8000;
          lVar13 = 0;
          lVar14 = 0;
          do {
            *(long *)(pcVar9 + -0x1000) = lVar13;
            *(long *)(pcVar9 + -0x800) = lVar14;
            *(long *)pcVar9 = lVar10;
            lVar10 = lVar10 + 0x1d2f;
            pcVar9 = pcVar9 + 8;
            lVar14 = lVar14 + 0x9646;
            lVar13 = lVar13 + 0x4c8b;
          } while (lVar10 != 0x1daf00);
          goto LAB_00104f64;
        }
        if (JVar1 != JCS_GRAYSCALE) goto LAB_00104f30;
      }
      pjVar7->color_convert = grayscale_convert;
      auVar5 = _DAT_0011a5b0;
      auVar4 = _DAT_0011a5a0;
      auVar3 = _DAT_0011a590;
      iVar6 = cinfo->num_components;
      if (1 < (long)iVar6) {
        lVar10 = (long)iVar6 + -2;
        auVar15._8_4_ = (int)lVar10;
        auVar15._0_8_ = lVar10;
        auVar15._12_4_ = (int)((ulong)lVar10 >> 0x20);
        pbVar11 = &cinfo->comp_info[1].component_needed;
        uVar12 = 0;
        auVar15 = auVar15 ^ _DAT_0011a5b0;
        do {
          auVar17._8_4_ = (int)uVar12;
          auVar17._0_8_ = uVar12;
          auVar17._12_4_ = (int)(uVar12 >> 0x20);
          auVar18 = (auVar17 | auVar4) ^ auVar5;
          iVar16 = auVar15._4_4_;
          if ((bool)(~(auVar18._4_4_ == iVar16 && auVar15._0_4_ < auVar18._0_4_ ||
                      iVar16 < auVar18._4_4_) & 1)) {
            *pbVar11 = 0;
          }
          if ((auVar18._12_4_ != auVar15._12_4_ || auVar18._8_4_ <= auVar15._8_4_) &&
              auVar18._12_4_ <= auVar15._12_4_) {
            pbVar11[0x18] = 0;
          }
          auVar17 = (auVar17 | auVar3) ^ auVar5;
          iVar19 = auVar17._4_4_;
          if (iVar19 <= iVar16 && (iVar19 != iVar16 || auVar17._0_4_ <= auVar15._0_4_)) {
            pbVar11[0x30] = 0;
            pbVar11[0x48] = 0;
          }
          uVar12 = uVar12 + 4;
          pbVar11 = pbVar11 + 0x60;
        } while ((iVar6 + 2U & 0xfffffffc) != uVar12);
      }
      goto LAB_00104f64;
    }
    if (JVar1 == cinfo->jpeg_color_space) {
      cinfo->out_color_components = cinfo->num_components;
      goto LAB_00104f27;
    }
  }
LAB_00104f30:
  pjVar2 = cinfo->err;
  pjVar2->msg_code = 0x1c;
  (*pjVar2->error_exit)((j_common_ptr)cinfo);
LAB_00104f64:
  iVar6 = 1;
  if (cinfo->quantize_colors == 0) {
    iVar6 = cinfo->out_color_components;
  }
  cinfo->output_components = iVar6;
  return;
}

Assistant:

GLOBAL(void)
jinit_color_deconverter (j_decompress_ptr cinfo)
{
  my_cconvert_ptr cconvert;
  int ci;

  cconvert = (my_cconvert_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				SIZEOF(my_color_deconverter));
  cinfo->cconvert = (struct jpeg_color_deconverter *) cconvert;
  cconvert->pub.start_pass = start_pass_dcolor;

  /* Make sure num_components agrees with jpeg_color_space */
  switch (cinfo->jpeg_color_space) {
  case JCS_GRAYSCALE:
    if (cinfo->num_components != 1)
      ERREXIT(cinfo, JERR_BAD_J_COLORSPACE);
    break;

  case JCS_RGB:
  case JCS_YCbCr:
    if (cinfo->num_components != 3)
      ERREXIT(cinfo, JERR_BAD_J_COLORSPACE);
    break;

  case JCS_CMYK:
  case JCS_YCCK:
    if (cinfo->num_components != 4)
      ERREXIT(cinfo, JERR_BAD_J_COLORSPACE);
    break;

  default:			/* JCS_UNKNOWN can be anything */
    if (cinfo->num_components < 1)
      ERREXIT(cinfo, JERR_BAD_J_COLORSPACE);
    break;
  }

  /* Set out_color_components and conversion method based on requested space.
   * Also clear the component_needed flags for any unused components,
   * so that earlier pipeline stages can avoid useless computation.
   */

  switch (cinfo->out_color_space) {
  case JCS_GRAYSCALE:
    cinfo->out_color_components = 1;
    if (cinfo->jpeg_color_space == JCS_GRAYSCALE ||
	cinfo->jpeg_color_space == JCS_YCbCr) {
      cconvert->pub.color_convert = grayscale_convert;
      /* For color->grayscale conversion, only the Y (0) component is needed */
      for (ci = 1; ci < cinfo->num_components; ci++)
	cinfo->comp_info[ci].component_needed = FALSE;
    } else if (cinfo->jpeg_color_space == JCS_RGB) {
      cconvert->pub.color_convert = rgb_gray_convert;
      build_rgb_y_table(cinfo);
    } else
      ERREXIT(cinfo, JERR_CONVERSION_NOTIMPL);
    break;

  case JCS_RGB:
    cinfo->out_color_components = RGB_PIXELSIZE;
    if (cinfo->jpeg_color_space == JCS_YCbCr) {
      cconvert->pub.color_convert = ycc_rgb_convert;
      build_ycc_rgb_table(cinfo);
    } else if (cinfo->jpeg_color_space == JCS_GRAYSCALE) {
      cconvert->pub.color_convert = gray_rgb_convert;
    } else if (cinfo->jpeg_color_space == JCS_RGB) {
      cconvert->pub.color_convert = rgb_convert;
    } else
      ERREXIT(cinfo, JERR_CONVERSION_NOTIMPL);
    break;

  case JCS_CMYK:
    cinfo->out_color_components = 4;
    if (cinfo->jpeg_color_space == JCS_YCCK) {
      cconvert->pub.color_convert = ycck_cmyk_convert;
      build_ycc_rgb_table(cinfo);
    } else if (cinfo->jpeg_color_space == JCS_CMYK) {
      cconvert->pub.color_convert = null_convert;
    } else
      ERREXIT(cinfo, JERR_CONVERSION_NOTIMPL);
    break;

  default:
    /* Permit null conversion to same output space */
    if (cinfo->out_color_space == cinfo->jpeg_color_space) {
      cinfo->out_color_components = cinfo->num_components;
      cconvert->pub.color_convert = null_convert;
    } else			/* unsupported non-null conversion */
      ERREXIT(cinfo, JERR_CONVERSION_NOTIMPL);
    break;
  }

  if (cinfo->quantize_colors)
    cinfo->output_components = 1; /* single colormapped output component */
  else
    cinfo->output_components = cinfo->out_color_components;
}